

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

string * __thiscall
cinatra::press_tool::bytes_to_string_abi_cxx11_
          (string *__return_storage_ptr__,press_tool *this,uint64_t bytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  double extraout_XMM0_Qb_01;
  string suffix;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  double local_1b8;
  double dStack_1b0;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  paVar1 = &local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  if (this < (press_tool *)0x40000001) {
    if (this < Elf64_Ehdr_00100000.e_ident_magic_str) {
      if (this < (press_tool *)0x401) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_1d8,0,0,"bytes",5);
        local_1b8 = (double)(long)this;
        dStack_1b0 = extraout_XMM0_Qb_01;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_1d8,0,0,"KB",2);
        local_1b8 = (double)(long)this * 0.0009765625;
        dStack_1b0 = extraout_XMM0_Qb_00;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_1d8,0,0,"MB",2);
      local_1b8 = (double)(long)this * 9.5367431640625e-07;
      dStack_1b0 = extraout_XMM0_Qb;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_1d8,0,0,"GB",2);
    auVar3._8_4_ = (int)((ulong)this >> 0x20);
    auVar3._0_8_ = this;
    auVar3._12_4_ = 0x45300000;
    dStack_1b0 = auVar3._8_8_ - 1.9342813113834067e+25;
    local_1b8 = (dStack_1b0 + ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) *
                9.313225746154785e-10;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string bytes_to_string(uint64_t bytes) {
  double rt;
  std::string suffix;
  if (bytes > GB_BYTE) {
    suffix = "GB";
    rt = (double(bytes) / GB_BYTE);
  }
  else if (bytes > MB_BYTE) {
    suffix = "MB";
    rt = (double(bytes) / MB_BYTE);
  }
  else if (bytes > KB_BYTE) {
    suffix = "KB";
    rt = (double(bytes) / KB_BYTE);
  }
  else {
    suffix = "bytes";
    rt = (double)bytes;
  }
  std::stringstream ss;
  ss << std::fixed << std::setprecision(3) << rt << suffix;
  return ss.str();
}